

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<cs::numeric_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::call(cni_helper<cs::numeric_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
       *this,vector *args)

{
  size_type sVar1;
  string *str;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  runtime_error *in_RDI;
  numeric *in_stack_fffffffffffffee8;
  runtime_error *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  cni_helper<cs::numeric_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs::numeric_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  *in_stack_ffffffffffffff38;
  
  __lhs = in_RDI;
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  if (sVar1 != 1) {
    str = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff28);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)in_RDI);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff28);
    std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    cs::runtime_error::runtime_error(in_RDI,str);
    __cxa_throw(str,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  _call<0>(in_stack_ffffffffffffff38,
           (vector *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
           (sequence<0> *)in_stack_ffffffffffffff28);
  return_to_cs<cs::numeric>(in_stack_fffffffffffffee8);
  return (any)(proxy *)__lhs;
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}